

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

tb_page_addr_t get_page_addr_code_hostp_x86_64(CPUArchState *env,target_ulong addr,void **hostp)

{
  _Bool _Var1;
  uint mmu_idx;
  ram_addr_t rVar2;
  ulong uVar3;
  uintptr_t size_mask;
  long lVar4;
  long lVar5;
  ulong index;
  ulong page;
  ulong mmu_idx_00;
  void *ptr;
  CPUX86State *__mptr;
  
  mmu_idx = cpu_mmu_index(env,SUB81(addr,0));
  mmu_idx_00 = (ulong)mmu_idx;
  index = env->regs[mmu_idx_00 * 2 + -8] >> 6 & addr >> 0xc;
  lVar4 = index * 0x40;
  lVar5 = env->regs[mmu_idx_00 * 2 + -7] + lVar4;
  uVar3 = *(ulong *)(env->regs[mmu_idx_00 * 2 + -7] + 0x10 + lVar4);
  page = addr & 0xfffffffffffff000;
  rVar2 = 0xffffffffffffffff;
  if ((uVar3 & 0xfffffffffffff800) != page) {
    _Var1 = victim_tlb_hit(env,mmu_idx_00,index,0x10,page);
    if (_Var1) {
      uVar3 = *(ulong *)(lVar5 + 0x10);
    }
    else {
      tlb_fill((CPUState *)(env[-6].mtrr_var + 4),addr,0,MMU_INST_FETCH,mmu_idx,0);
      lVar5 = (env->regs[mmu_idx_00 * 2 + -8] >> 6 & addr >> 0xc) * 0x40;
      uVar3 = *(ulong *)(env->regs[mmu_idx_00 * 2 + -7] + 0x10 + lVar5);
      if (((uint)uVar3 >> 0xb & 1) != 0) {
        return 0xffffffffffffffff;
      }
      lVar5 = env->regs[mmu_idx_00 * 2 + -7] + lVar5;
    }
    if ((uVar3 & 0xfffffffffffff800) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_x86_64(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if (((uint)uVar3 >> 9 & 1) == 0) {
    ptr = (void *)(addr + *(long *)(lVar5 + 0x20));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    rVar2 = qemu_ram_addr_from_host_x86_64(env->uc,ptr);
    if (rVar2 == 0xffffffffffffffff) {
      abort();
    }
  }
  else if (hostp != (void **)0x0) {
    *hostp = (void *)0x0;
  }
  return rVar2;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}